

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_subfi_i32_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i32 ret,int32_t arg1,TCGv_i32 arg2)

{
  TCGv_i32 arg1_00;
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  
  if (arg1 != 0) {
    arg1_00 = tcg_const_i32_mipsel(tcg_ctx,arg1);
    tcg_gen_sub_i32(tcg_ctx,ret,arg1_00,arg2);
    tcg_temp_free_internal_mipsel(tcg_ctx,(TCGTemp *)(arg1_00 + (long)tcg_ctx));
    return;
  }
  pTVar1 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_neg_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_subfi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, int32_t arg1, TCGv_i32 arg2)
{
    if (arg1 == 0 && TCG_TARGET_HAS_neg_i32) {
        /* Don't recurse with tcg_gen_neg_i32.  */
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_neg_i32, ret, arg2);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg1);
        tcg_gen_sub_i32(tcg_ctx, ret, t0, arg2);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}